

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O3

void onConnect(int fd)

{
  undefined1 *puVar1;
  undefined8 ud_;
  Codecc *this;
  undefined1 local_d0 [16];
  any local_c0;
  undefined1 local_b0 [24];
  Ptr sc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_60;
  string msg;
  Ptr sendMsg;
  int local_1c [2];
  int fd_local;
  
  local_1c[0] = fd;
  printf("onConnect %d\n",fd);
  hwnet::TCPSocket::New
            ((TCPSocket *)(local_b0 + 0x10),&poller_,
             pools.super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>.
             _M_impl.super__Vector_impl_data._M_start
             [(ulong)(long)fd %
              (ulong)((long)pools.
                            super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)pools.
                            super__Vector_base<hwnet::ThreadPool_*,_std::allocator<hwnet::ThreadPool_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3)],fd);
  this = (Codecc *)operator_new(0x28);
  Codecc::Codecc(this,(long)packetSize);
  ud_ = local_b0._16_8_;
  local_c0.counter = (int *)operator_new(4);
  *(undefined4 *)&(((element_type *)local_c0.counter)->super_Task)._vptr_Task = 1;
  local_c0.content = (placeholder *)operator_new(0x10);
  (local_c0.content)->_vptr_placeholder = (_func_int **)&PTR__placeholder_00126768;
  local_c0.content[1]._vptr_placeholder = (_func_int **)this;
  hwnet::TCPSocket::SetUserData((TCPSocket *)local_d0,(any *)ud_);
  msg._M_dataplus._M_p = (pointer)0x0;
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)onDataClient;
  msg.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
       ::_M_invoke;
  msg._M_string_length =
       (size_type)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_const_std::shared_ptr<hwnet::Buffer>_&,_unsigned_long)>
       ::_M_manager;
  hwnet::TCPSocket::SetRecvCallback((TCPSocket *)local_80,(RecvCallback *)local_d0._0_8_);
  sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  msg.field_2._8_8_ = onError;
  sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       _Function_handler<void_(const_std::shared_ptr<hwnet::TCPSocket>_&,_int),_void_(*)(const_std::shared_ptr<hwnet::TCPSocket>_&,_int)>
       ::_M_manager;
  hwnet::TCPSocket::SetErrorCallback
            ((TCPSocket *)
             &sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (ErrorCallback *)local_80._0_8_);
  hwnet::TCPSocket::Start((TCPSocket *)local_70);
  Codecc::GetRecvBuffer((Codecc *)local_b0);
  hwnet::TCPSocket::Recv((TCPSocket *)local_70._0_8_,(Ptr *)local_b0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    puVar1 = (undefined1 *)((long)&msg.field_2 + 8);
    (*(code *)sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)(puVar1,puVar1,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  if (msg._M_string_length != 0) {
    (*(code *)msg._M_string_length)(&local_60,&local_60,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  hwnet::any::_destroy(&local_c0);
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"hello","");
  local_70._0_8_ = (_func_int **)0xd;
  sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  msg.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<hwnet::Buffer,std::allocator<hwnet::Buffer>,unsigned_long&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&sendMsg,
             (Buffer **)((long)&msg.field_2 + 8),(allocator<hwnet::Buffer> *)local_80,
             (unsigned_long *)local_70,
             (unsigned_long *)
             &sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_70._0_4_ = 0x9000000;
  hwnet::Buffer::Append((Buffer *)msg.field_2._8_8_,local_70,4);
  hwnet::Buffer::Append((Buffer *)msg.field_2._8_8_,(char *)local_1c,4);
  hwnet::Buffer::Append
            ((Buffer *)msg.field_2._8_8_,(char *)local_60._M_pi,(size_t)msg._M_dataplus._M_p);
  hwnet::TCPSocket::Send((TCPSocket *)local_b0._16_8_,(Ptr *)((long)&msg.field_2 + 8),0);
  LOCK();
  ccount.super___atomic_base<int>._M_i =
       (__atomic_base<int>)((int)ccount.super___atomic_base<int>._M_i + 1);
  UNLOCK();
  if (sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sendMsg.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (local_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&msg._M_string_length) {
    operator_delete(local_60._M_pi,msg._M_string_length + 1);
  }
  if (sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               sc.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void onConnect(int fd) {
	printf("onConnect %d\n",fd);
	ThreadPool *t = pools[fd%pools.size()];
	auto sc = TCPSocket::New(&poller_,t,fd);
	auto code = new Codecc(packetSize);
	sc->SetUserData(code)->SetRecvCallback(onDataClient)->SetErrorCallback(onError)->Start()->Recv(code->GetRecvBuffer());
	
	std::string msg = std::string("hello");
	auto sendMsg = Buffer::New(5+4+4);
	int len = 5 + 4;
	len = htonl(len);
	sendMsg->Append((const char *)&len,4);
	sendMsg->Append((const char *)&fd,4);	
	sendMsg->Append(msg);
	sc->Send(sendMsg);
	ccount++;
	
}